

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathRegisterNs(xmlXPathContextPtr ctxt,xmlChar *prefix,xmlChar *ns_uri)

{
  xmlHashTablePtr pxVar1;
  xmlChar *userdata;
  xmlChar *ns_uri_local;
  xmlChar *prefix_local;
  xmlXPathContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathContextPtr)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else if (prefix == (xmlChar *)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else if (*prefix == '\0') {
    ctxt_local._4_4_ = -1;
  }
  else {
    if (ctxt->nsHash == (xmlHashTablePtr)0x0) {
      pxVar1 = xmlHashCreate(10);
      ctxt->nsHash = pxVar1;
    }
    if (ctxt->nsHash == (xmlHashTablePtr)0x0) {
      ctxt_local._4_4_ = -1;
    }
    else if (ns_uri == (xmlChar *)0x0) {
      ctxt_local._4_4_ = xmlHashRemoveEntry(ctxt->nsHash,prefix,xmlHashDefaultDeallocator);
    }
    else {
      pxVar1 = ctxt->nsHash;
      userdata = xmlStrdup(ns_uri);
      ctxt_local._4_4_ = xmlHashUpdateEntry(pxVar1,prefix,userdata,xmlHashDefaultDeallocator);
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlXPathRegisterNs(xmlXPathContextPtr ctxt, const xmlChar *prefix,
			   const xmlChar *ns_uri) {
    if (ctxt == NULL)
	return(-1);
    if (prefix == NULL)
	return(-1);
    if (prefix[0] == 0)
	return(-1);

    if (ctxt->nsHash == NULL)
	ctxt->nsHash = xmlHashCreate(10);
    if (ctxt->nsHash == NULL)
	return(-1);
    if (ns_uri == NULL)
        return(xmlHashRemoveEntry(ctxt->nsHash, prefix,
	                          xmlHashDefaultDeallocator));
    return(xmlHashUpdateEntry(ctxt->nsHash, prefix, (void *) xmlStrdup(ns_uri),
			      xmlHashDefaultDeallocator));
}